

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarBinds.h
# Opt level: O3

void __thiscall
VarBind::VarBind(VarBind *this,SortableOIDType *oid,shared_ptr<BER_CONTAINER> *value)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  OIDType::cloneOID((OIDType *)this);
  peVar1 = (value->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->type = peVar1->_type;
  (this->value).super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  p_Var2 = (value->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->value).super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->errorStatus = NO_ERROR;
  return;
}

Assistant:

VarBind(const SortableOIDType* oid, const std::shared_ptr<BER_CONTAINER>& value): oid(oid->cloneOID()), type(value->_type), value(value){}